

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBuiltinPrecisionTests.cpp
# Opt level: O1

TestCaseGroup * deqp::gles31::Functional::createBuiltinPrecisionTests(Context *context)

{
  TestCaseGroup *this;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es31Cases;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es3Cases;
  ShaderType local_4c;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> local_48;
  CaseFactories *local_30;
  CaseFactories *local_20;
  
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"precision","Builtin precision tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  this->m_context = context;
  local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_start = (ShaderType *)0x0;
  local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_finish = (ShaderType *)0x0;
  local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ShaderType *)0x0;
  gls::BuiltinPrecisionTests::createES3BuiltinCases();
  gls::BuiltinPrecisionTests::createES31BuiltinCases();
  local_4c = SHADERTYPE_COMPUTE;
  if (local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_48,
               (iterator)
               local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_4c);
  }
  else {
    *local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_COMPUTE;
    local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (context->m_testCtx,context->m_renderCtx,local_20,&local_48,(TestCaseGroup *)this);
  if (local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_4c = SHADERTYPE_VERTEX;
  if (local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_48,
               (iterator)
               local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_4c);
  }
  else {
    *local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_VERTEX;
    local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_4c = SHADERTYPE_FRAGMENT;
  if (local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_48,
               (iterator)
               local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_4c);
  }
  else {
    *local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_FRAGMENT;
    local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_4c = SHADERTYPE_COMPUTE;
  if (local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_48,
               (iterator)
               local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_4c);
  }
  else {
    *local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_COMPUTE;
    local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (context->m_testCtx,context->m_renderCtx,local_30,&local_48,(TestCaseGroup *)this);
  if (local_30 != (CaseFactories *)0x0) {
    (*local_30->_vptr_CaseFactories[1])();
    local_30 = (CaseFactories *)0x0;
  }
  if (local_20 != (CaseFactories *)0x0) {
    (*local_20->_vptr_CaseFactories[1])();
    local_20 = (CaseFactories *)0x0;
  }
  if (local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_start != (ShaderType *)0x0) {
    operator_delete(local_48.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

TestCaseGroup* createBuiltinPrecisionTests (Context& context)
{
	TestCaseGroup*							group		= new TestCaseGroup(
		context, "precision", "Builtin precision tests");
	std::vector<glu::ShaderType>			shaderTypes;
	de::MovePtr<const bpt::CaseFactories>	es3Cases		= bpt::createES3BuiltinCases();
	de::MovePtr<const bpt::CaseFactories>	es31Cases		= bpt::createES31BuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es3Cases,
								  shaderTypes,
								  *group);

	shaderTypes.clear();
	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);
	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es31Cases,
								  shaderTypes,
								  *group);
	return group;
}